

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O0

void __thiscall
helics::NetworkCommsInterface::setPortNumber(NetworkCommsInterface *this,int localPortNumber)

{
  bool bVar1;
  __int_type_conflict _Var2;
  __int_type_conflict in_ESI;
  CommsInterface *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  CommsInterface *this_00;
  
  this_00 = in_RDI;
  bVar1 = CommsInterface::propertyLock(in_RDI);
  if (bVar1) {
    CLI::std::__atomic_base<int>::operator=((__atomic_base<int> *)this_00,in_ESI);
    _Var2 = std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)this_00);
    if (0 < _Var2) {
      *(undefined1 *)&in_RDI[1].rxStatus._M_i = CONNECTED;
    }
    CommsInterface::propertyUnLock((CommsInterface *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void NetworkCommsInterface::setPortNumber(int localPortNumber)
{
    if (propertyLock()) {
        PortNumber = localPortNumber;
        if (PortNumber > 0) {
            autoPortNumber = false;
        }
        propertyUnLock();
    }
}